

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

QUEUE * __thiscall QUEUE::operator<<(QUEUE *this,int e)

{
  int iVar1;
  int iVar2;
  overflow_error *this_00;
  int local_30;
  int i;
  int input_length;
  int tmp;
  int local_14;
  QUEUE *pQStack_10;
  int e_local;
  QUEUE *this_local;
  
  local_14 = e;
  pQStack_10 = this;
  iVar1 = (*(this->super_STACK)._vptr_STACK[9])();
  if (iVar1 != 1) {
    iVar1 = STACK::operator_cast_to_int(&this->super_STACK);
    iVar2 = (**(this->super_STACK)._vptr_STACK)();
    if (iVar1 == iVar2) {
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        STACK::operator>>(&this->super_STACK,&i);
        STACK::operator<<(&this->s2,i);
      }
    }
    STACK::operator<<(&this->super_STACK,local_14);
    return this;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"[ERROR] Queue overflowed!");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

QUEUE &QUEUE::operator << (int e) {
  if (full() == 1)
    throw std::overflow_error("[ERROR] Queue overflowed!");
	// If input stack is full
  int tmp;
  int input_length = this->STACK::operator int();
  if (input_length == this->size()) {
    for (int i = 0; i < input_length; i++) {
      this->STACK::operator>>(tmp);
      s2 << tmp;
    }
  }
  this->STACK::operator<<(e);
	return *this;
}